

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O3

bool tinyusdz::hasQuotes(string *str,bool is_double_quote)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  
  uVar2 = str->_M_string_length;
  if (uVar2 == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
    uVar3 = 1;
    do {
      cVar1 = (str->_M_dataplus)._M_p[uVar3 - 1];
      if (is_double_quote) {
        if (cVar1 == '\"') {
          return bVar4;
        }
      }
      else if (cVar1 == '\'') {
        return bVar4;
      }
      bVar4 = uVar3 < uVar2;
      bVar5 = uVar3 != uVar2;
      uVar3 = uVar3 + 1;
    } while (bVar5);
  }
  return bVar4;
}

Assistant:

bool hasQuotes(const std::string &str, bool is_double_quote) {
  for (size_t i = 0; i < str.size(); i++) {
    if (is_double_quote) {
      if (str[i] == '"') {
        return true;
      }
    } else {
      if (str[i] == '\'') {
        return true;
      }
    }
  }

  return false;
}